

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O2

void TvCtrlPointHandleSubscribeUpdate(char *eventURL,char *sid,int timeout)

{
  TvDeviceNode *pTVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char *__s1;
  TvDeviceNode **ppTVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
  ppTVar5 = &GlobalDeviceList;
  do {
    pTVar1 = *ppTVar5;
    if (pTVar1 == (TvDeviceNode *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
      return;
    }
    lVar4 = -1;
    pcVar2 = (pTVar1->device).TvService[0].EventURL;
    do {
      __s1 = pcVar2;
      if (lVar4 == 1) goto LAB_001054ab;
      iVar3 = strcmp(__s1,eventURL);
      lVar4 = lVar4 + 1;
      pcVar2 = __s1 + 0x520;
    } while (iVar3 != 0);
    SampleUtil_Print("Received Tv %s Event Renewal for eventURL %s\n",TvServiceName[lVar4],eventURL)
    ;
    strcpy(__s1 + 0x200,sid);
LAB_001054ab:
    ppTVar5 = &pTVar1->next;
  } while( true );
}

Assistant:

void TvCtrlPointHandleSubscribeUpdate(
	const char *eventURL, const Upnp_SID sid, int timeout)
{
	struct TvDeviceNode *tmpdevnode;
	int service;
	(void)timeout;

	ithread_mutex_lock(&DeviceListMutex);

	tmpdevnode = GlobalDeviceList;
	while (tmpdevnode) {
		for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
			if (strcmp(tmpdevnode->device.TvService[service]
					    .EventURL,
				    eventURL) == 0) {
				SampleUtil_Print("Received Tv %s Event Renewal "
						 "for eventURL %s\n",
					TvServiceName[service],
					eventURL);
				strcpy(tmpdevnode->device.TvService[service]
						.SID,
					sid);
				break;
			}
		}

		tmpdevnode = tmpdevnode->next;
	}

	ithread_mutex_unlock(&DeviceListMutex);

	return;
}